

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O2

void __thiscall
QCommandLineOption::QCommandLineOption
          (QCommandLineOption *this,QString *name,QString *description,QString *valueName,
          QString *defaultValue)

{
  QCommandLineOptionPrivate *this_00;
  
  this_00 = (QCommandLineOptionPrivate *)operator_new(0x70);
  QCommandLineOptionPrivate::QCommandLineOptionPrivate(this_00,name);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  setValueName(this,valueName);
  setDescription(this,description);
  setDefaultValue(this,defaultValue);
  return;
}

Assistant:

QCommandLineOption::QCommandLineOption(const QString &name, const QString &description,
                                       const QString &valueName,
                                       const QString &defaultValue)
    : d(new QCommandLineOptionPrivate(name))
{
    setValueName(valueName);
    setDescription(description);
    setDefaultValue(defaultValue);
}